

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentSpecNode.cpp
# Opt level: O2

void __thiscall xercesc_4_0::ContentSpecNode::formatSpec(ContentSpecNode *this,XMLBuffer *bufToFill)

{
  ValueVectorOf<xercesc_4_0::formatNodeHolder> *pVVar1;
  ContentSpecNode *pCVar2;
  ContentSpecNode *pCVar3;
  bool bVar4;
  XMLCh toAppend;
  int iVar5;
  NodeTypes NVar6;
  undefined4 extraout_var;
  ContentSpecNode *pCVar7;
  XMLCh *chars;
  NodeTypes NVar8;
  formatNodeHolder fVar9;
  formatNodeHolder local_80;
  uint local_6c;
  ValueStackOf<xercesc_4_0::formatNodeHolder> local_68;
  ContentSpecNode *local_38;
  
  bufToFill->fIndex = 0;
  if (this->fType == Leaf) {
    XMLBuffer::append(bufToFill,L'(');
  }
  local_68.fVector.fMemoryManager = this->fMemoryManager;
  local_68.fVector.fCallDestructor = false;
  local_68.fVector.fCurCount = 0;
  local_68.fVector.fMaxCount = 10;
  iVar5 = (*(local_68.fVector.fMemoryManager)->_vptr_MemoryManager[3])();
  local_68.fVector.fElemList = (formatNodeHolder *)CONCAT44(extraout_var,iVar5);
  memset(local_68.fVector.fElemList,0,0xa0);
  local_80.parentType = UnknownType;
  local_80.character = L'\0';
  local_80.node = this;
  local_38 = this;
  ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(&local_68.fVector,&local_80);
  local_6c = 0xffffffff;
  do {
    do {
      do {
        while( true ) {
          if (local_68.fVector.fCurCount == 0) {
            ValueVectorOf<xercesc_4_0::formatNodeHolder>::~ValueVectorOf(&local_68.fVector);
            if (local_38->fType == Leaf) {
              XMLBuffer::append(bufToFill,L')');
            }
            return;
          }
          fVar9 = ValueStackOf<xercesc_4_0::formatNodeHolder>::pop(&local_68);
          pCVar7 = fVar9.node;
          if (fVar9.character == L'\0') break;
          XMLBuffer::append(bufToFill,fVar9.character);
        }
      } while (pCVar7 == (ContentSpecNode *)0x0);
      pCVar2 = pCVar7->fFirst;
      NVar8 = fVar9.parentType;
      if (pCVar2 == (ContentSpecNode *)0x0) {
        NVar6 = Leaf;
LAB_002e1d92:
        bVar4 = false;
        if ((NVar8 == UnknownType) && (NVar6 == Leaf)) goto LAB_002e1d9e;
      }
      else {
        NVar6 = pCVar2->fType;
        if ((NVar8 == UnknownType) || (NVar6 == Leaf)) goto LAB_002e1d92;
LAB_002e1d9e:
        bVar4 = true;
      }
      NVar6 = pCVar7->fType;
    } while (9 < (uint)(NVar6 & (Any_NS|Any_Other)));
    pCVar3 = pCVar7->fSecond;
    switch(NVar6 & (Any_NS|Any_Other)) {
    case Leaf:
      if (pCVar7->fElement->fURIId != local_6c) {
        chars = QName::getRawName(pCVar7->fElement);
        XMLBuffer::append(bufToFill,chars);
        if (pCVar7->fMinOccurs == 1) {
          toAppend = L'+';
          if (pCVar7->fMaxOccurs != -1 && pCVar7->fMaxOccurs < 2) break;
        }
        else {
          if (pCVar7->fMinOccurs != 0) break;
          iVar5 = pCVar7->fMaxOccurs;
          toAppend = L'*';
          if ((iVar5 < 2 && iVar5 != -1) && (toAppend = L'?', iVar5 != 1)) break;
        }
        XMLBuffer::append(bufToFill,toAppend);
        break;
      }
      XMLBuffer::append(bufToFill,(XMLCh *)XMLElementDecl::fgPCDataElemName);
      break;
    case ZeroOrOne:
      if (bVar4) {
        XMLBuffer::append(bufToFill,L'(');
      }
      local_80.node = (ContentSpecNode *)0x0;
      local_80.parentType = UnknownType;
      local_80.character = L'?';
      pVVar1 = &local_68.fVector;
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      if (bVar4) {
        local_80.node = (ContentSpecNode *)0x0;
        local_80.parentType = UnknownType;
        local_80.character = L')';
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      }
      local_80.character = L'\0';
      local_80.node = pCVar2;
      local_80.parentType = NVar6;
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      break;
    case ZeroOrMore:
      if (bVar4) {
        XMLBuffer::append(bufToFill,L'(');
      }
      local_80.node = (ContentSpecNode *)0x0;
      local_80.parentType = UnknownType;
      local_80.character = L'*';
      pVVar1 = &local_68.fVector;
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      if (bVar4) {
        local_80.node = (ContentSpecNode *)0x0;
        local_80.parentType = UnknownType;
        local_80.character = L')';
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      }
      local_80.character = L'\0';
      local_80.node = pCVar2;
      local_80.parentType = NVar6;
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      break;
    case OneOrMore:
      if (bVar4) {
        XMLBuffer::append(bufToFill,L'(');
      }
      local_80.node = (ContentSpecNode *)0x0;
      local_80.parentType = UnknownType;
      local_80.character = L'+';
      pVVar1 = &local_68.fVector;
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      if (bVar4) {
        local_80.node = (ContentSpecNode *)0x0;
        local_80.parentType = UnknownType;
        local_80.character = L')';
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      }
      local_80.character = L'\0';
      local_80.node = pCVar2;
      local_80.parentType = NVar6;
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      break;
    case Choice:
      if ((NVar8 & (Any_NS|Any_Other)) != Choice) {
        XMLBuffer::append(bufToFill,L'(');
        local_80.node = (ContentSpecNode *)0x0;
        local_80.parentType = UnknownType;
        local_80.character = L')';
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(&local_68.fVector,&local_80);
      }
      if (pCVar3 != (ContentSpecNode *)0x0) {
        local_80.character = L'\0';
        local_80.node = pCVar3;
        local_80.parentType = NVar6;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(&local_68.fVector,&local_80);
        local_80.node = (ContentSpecNode *)0x0;
        local_80.parentType = UnknownType;
        local_80.character = L'|';
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(&local_68.fVector,&local_80);
      }
      local_80.character = L'\0';
      local_80.node = pCVar2;
      local_80.parentType = NVar6;
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(&local_68.fVector,&local_80);
      break;
    case Sequence:
      if ((NVar8 & (Any_NS|Any_Other)) != Sequence) {
        XMLBuffer::append(bufToFill,L'(');
        local_80.node = (ContentSpecNode *)0x0;
        local_80.parentType = UnknownType;
        local_80.character = L')';
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(&local_68.fVector,&local_80);
      }
      if (pCVar3 != (ContentSpecNode *)0x0) {
        local_80.character = L'\0';
        local_80.node = pCVar3;
        local_80.parentType = NVar6;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(&local_68.fVector,&local_80);
        local_80.node = (ContentSpecNode *)0x0;
        local_80.parentType = UnknownType;
        local_80.character = L',';
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(&local_68.fVector,&local_80);
      }
      local_80.character = L'\0';
      local_80.node = pCVar2;
      local_80.parentType = NVar6;
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(&local_68.fVector,&local_80);
      break;
    case All:
      if ((NVar8 & (Any_NS|Any_Other)) != All) {
        XMLBuffer::append(bufToFill,L'A');
        XMLBuffer::append(bufToFill,L'l');
        XMLBuffer::append(bufToFill,L'l');
        XMLBuffer::append(bufToFill,L'(');
        local_80.node = (ContentSpecNode *)0x0;
        local_80.parentType = UnknownType;
        local_80.character = L')';
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(&local_68.fVector,&local_80);
      }
      local_80.character = L'\0';
      pVVar1 = &local_68.fVector;
      local_80.node = pCVar3;
      local_80.parentType = NVar6;
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      local_80.node = (ContentSpecNode *)0x0;
      local_80.parentType = UnknownType;
      local_80.character = L',';
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
      local_80.character = L'\0';
      local_80.node = pCVar2;
      local_80.parentType = NVar6;
      ValueVectorOf<xercesc_4_0::formatNodeHolder>::addElement(pVVar1,&local_80);
    }
  } while( true );
}

Assistant:

void ContentSpecNode::formatSpec(XMLBuffer&      bufToFill) const
{
    // Clean out the buffer first
    bufToFill.reset();

    if (fType == ContentSpecNode::Leaf)
        bufToFill.append(chOpenParen);
    formatNode
    (
        this
		, bufToFill
        , fMemoryManager
    );
    if (fType == ContentSpecNode::Leaf)
        bufToFill.append(chCloseParen);
}